

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::Runner::runTest(Totals *__return_storage_ptr__,Runner *this,TestCaseInfo *testInfo)

{
  bool bVar1;
  uint uVar2;
  IReporter *pIVar3;
  RunningTest *pRVar4;
  TestCaseInfo *this_00;
  SourceLineInfo *lineInfo;
  IContext *pIVar5;
  byte local_c2;
  byte local_b2;
  undefined1 local_78 [8];
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCaseInfo *testInfo_local;
  Runner *this_local;
  
  redirectedCout.field_2._8_8_ = (this->m_totals).assertions.passed;
  std::__cxx11::string::string((string *)(redirectedCerr.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  pIVar3 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,testInfo);
  pRVar4 = (RunningTest *)operator_new(0x68);
  RunningTest::RunningTest(pRVar4,testInfo);
  this->m_runningTest = pRVar4;
  do {
    do {
      this_00 = RunningTest::getTestCaseInfo(this->m_runningTest);
      lineInfo = TestCaseInfo::getLineInfo(this_00);
      ResultInfoBuilder::setLineInfo(&this->m_currentResult,lineInfo);
      runCurrentTest(this,(string *)((long)&redirectedCerr.field_2 + 8),(string *)local_78);
      bVar1 = RunningTest::hasUntestedSections(this->m_runningTest);
      local_b2 = 0;
      if (bVar1) {
        bVar1 = aborting(this);
        local_b2 = bVar1 ^ 0xff;
      }
    } while ((local_b2 & 1) != 0);
    pIVar5 = getCurrentContext();
    uVar2 = (*pIVar5->_vptr_IContext[5])();
    local_c2 = 0;
    if ((uVar2 & 1) != 0) {
      bVar1 = aborting(this);
      local_c2 = bVar1 ^ 0xff;
    }
  } while ((local_c2 & 1) != 0);
  pRVar4 = this->m_runningTest;
  if (pRVar4 != (RunningTest *)0x0) {
    RunningTest::~RunningTest(pRVar4);
    operator_delete(pRVar4,0x68);
  }
  this->m_runningTest = (RunningTest *)0x0;
  Totals::delta(__return_storage_ptr__,&this->m_totals,(Totals *)((long)&redirectedCout.field_2 + 8)
               );
  Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
  pIVar3 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])
            (pIVar3,testInfo,__return_storage_ptr__,
             (undefined1 *)((long)&redirectedCerr.field_2 + 8),local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(redirectedCerr.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( const TestCaseInfo& testInfo ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            m_reporter->StartTestCase( testInfo );

            m_runningTest = new RunningTest( &testInfo );

            do {
                do {
                    m_currentResult.setLineInfo( m_runningTest->getTestCaseInfo().getLineInfo() );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( m_runningTest->hasUntestedSections() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            delete m_runningTest;
            m_runningTest = NULL;

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->EndTestCase( testInfo, deltaTotals, redirectedCout, redirectedCerr );
            return deltaTotals;
        }